

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu511.c
# Opt level: O2

MPP_RET hal_h264e_vepu511_ret_task(void *hal,HalEncTask *task)

{
  long lVar1;
  EncRcTask *pEVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  uVar5 = *(int *)(*(long *)((long)hal + 0x60) + 0x40) *
          *(int *)(*(long *)((long)hal + 0x60) + 0x3c);
  pEVar2 = task->rc_task;
  lVar1 = *(long *)((long)hal + 0x160) + (long)(task->flags).reg_idx * 0x1514;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu511","enter %p\n","hal_h264e_vepu511_ret_task",hal);
  }
  *(uint *)((long)hal + 0x2e8) = uVar5;
  iVar3 = (*(uint *)(lVar1 + 0x1138) & 0x3ff) * 4;
  *(int *)((long)hal + 0x2f0) = iVar3;
  uVar4 = *(uint *)(lVar1 + 0x1138) >> 0xe & 0xffc;
  *(uint *)((long)hal + 0x2f4) = uVar4;
  iVar6 = (*(uint *)(lVar1 + 0x113c) & 0x3ff) * 4;
  *(int *)((long)hal + 0x2f8) = iVar6;
  uVar7 = *(uint *)(lVar1 + 0x113c) >> 0xe & 0xffc;
  *(uint *)((long)hal + 0x2fc) = uVar7;
  *(uint *)((long)hal + 0x300) = uVar7 + iVar6 + uVar4 + iVar3;
  *(undefined4 *)((long)hal + 0x1d4) = *(undefined4 *)(*(long *)((long)hal + 0x1a8) + 0x2c);
  task->length = task->length + task->hw_length;
  iVar3 = task->hw_length << 3;
  (pEVar2->info).bit_real = iVar3;
  uVar4 = *(uint *)(lVar1 + 0x1090) / uVar5;
  (pEVar2->info).quality_real = uVar4;
  uVar5 = (((*(uint *)(lVar1 + 0x1118) & 0x1fffff) +
           (*(uint *)(lVar1 + 0x111c) & 0x7fffff) + (*(uint *)(lVar1 + 0x1120) & 0x7fffff)) * 0x100)
          / uVar5;
  (pEVar2->info).iblk4_prop = uVar5;
  (pEVar2->info).sse = (ulong)*(uint6 *)(lVar1 + 0x108a);
  (pEVar2->info).lvl16_inter_num = *(uint *)(lVar1 + 0x110c) & 0x1fffff;
  (pEVar2->info).lvl8_inter_num = *(uint *)(lVar1 + 0x1110) & 0x7fffff;
  (pEVar2->info).lvl16_intra_num = *(uint *)(lVar1 + 0x1118) & 0x1fffff;
  (pEVar2->info).lvl8_intra_num = *(uint *)(lVar1 + 0x111c) & 0x7fffff;
  (pEVar2->info).lvl4_intra_num = *(uint *)(lVar1 + 0x1120) & 0x7fffff;
  *(int *)((long)hal + 0xb0) = iVar3;
  *(uint *)((long)hal + 0xb4) = uVar4;
  *(uint *)((long)hal + 0xc0) = uVar5;
  (task->hal_ret).data = (void *)((long)hal + 0x90);
  (task->hal_ret).number = 1;
  mpp_dev_multi_offset_reset(*(MppDevRegOffCfgs **)((long)hal + 0x38));
  if (*(H264eDpb **)((long)hal + 0x70) != (H264eDpb *)0x0) {
    h264e_dpb_hal_end(*(H264eDpb **)((long)hal + 0x70),(task->flags).curr_idx);
    h264e_dpb_hal_end(*(H264eDpb **)((long)hal + 0x70),(task->flags).refr_idx);
  }
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu511","leave %p\n","hal_h264e_vepu511_ret_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu511_ret_task(void * hal, HalEncTask * task)
{
    HalH264eVepu511Ctx *ctx = (HalH264eVepu511Ctx *)hal;
    HalVepu511RegSet *regs = &ctx->regs_sets[task->flags.reg_idx];
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    Vepu511H264Fbk *fb = &ctx->feedback;
    Vepu511Status *reg_st = &regs->reg_st;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 mbs = mb_w * mb_h;

    hal_h264e_dbg_func("enter %p\n", hal);

    fb->st_mb_num = mbs;
    fb->st_smear_cnt[0] = reg_st->st_smear_cnt0.rdo_smear_cnt0 * 4;
    fb->st_smear_cnt[1] = reg_st->st_smear_cnt0.rdo_smear_cnt1 * 4;
    fb->st_smear_cnt[2] = reg_st->st_smear_cnt1.rdo_smear_cnt2 * 4;
    fb->st_smear_cnt[3] = reg_st->st_smear_cnt1.rdo_smear_cnt3 * 4;
    fb->st_smear_cnt[4] = fb->st_smear_cnt[0] + fb->st_smear_cnt[1] +
                          fb->st_smear_cnt[2] + fb->st_smear_cnt[3];
    fb->frame_type = ctx->slice->slice_type;

    // update total hardware length
    task->length += task->hw_length;

    // setup bit length for rate control
    rc_info->bit_real = task->hw_length * 8;
    rc_info->quality_real = regs->reg_st.qp_sum / mbs;
    rc_info->iblk4_prop = (regs->reg_st.st_pnum_i4.pnum_i4 +
                           regs->reg_st.st_pnum_i8.pnum_i8 +
                           regs->reg_st.st_pnum_i16.pnum_i16) * 256 / mbs;

    rc_info->sse = ((RK_S64)regs->reg_st.sse_h32 << 16) +
                   (regs->reg_st.st_sse_bsl.sse_l16 & 0xffff);
    rc_info->lvl16_inter_num = regs->reg_st.st_pnum_p16.pnum_p16;
    rc_info->lvl8_inter_num  = regs->reg_st.st_pnum_p8.pnum_p8;
    rc_info->lvl16_intra_num = regs->reg_st.st_pnum_i16.pnum_i16;
    rc_info->lvl8_intra_num  = regs->reg_st.st_pnum_i8.pnum_i8;
    rc_info->lvl4_intra_num  = regs->reg_st.st_pnum_i4.pnum_i4;

    ctx->hal_rc_cfg.bit_real = rc_info->bit_real;
    ctx->hal_rc_cfg.quality_real = rc_info->quality_real;
    ctx->hal_rc_cfg.iblk4_prop = rc_info->iblk4_prop;

    task->hal_ret.data   = &ctx->hal_rc_cfg;
    task->hal_ret.number = 1;

    mpp_dev_multi_offset_reset(ctx->offsets);

    if (ctx->dpb) {
        h264e_dpb_hal_end(ctx->dpb, task->flags.curr_idx);
        h264e_dpb_hal_end(ctx->dpb, task->flags.refr_idx);
    }

    // vepu511_h264e_tune_stat_update(ctx->tune, task);

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}